

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> __thiscall
cmMakefile::RemoveFunctionBlocker(cmMakefile *this,cmFunctionBlocker *fb,cmListFileFunction *lff)

{
  cmFunctionBlocker **ppcVar1;
  char cVar2;
  _func_int *p_Var3;
  ostream *poVar4;
  cmCommandContext *in_RCX;
  _func_int *p_Var5;
  cmFunctionBlocker *pcVar6;
  const_iterator __position;
  cmListFileContext closingContext;
  ostringstream e;
  string local_210;
  cmListFileContext local_1f0;
  ostream local_1a8;
  
  if ((_func_int **)fb[9].StartingContext.Line == fb[10]._vptr_cmFunctionBlocker) {
    p_Var3 = (_func_int *)0x0;
  }
  else {
    p_Var3 = fb[10]._vptr_cmFunctionBlocker[-1];
  }
  __position._M_current =
       (cmFunctionBlocker **)fb[9].StartingContext.FilePath.field_2._M_allocated_capacity;
  p_Var5 = (_func_int *)
           ((long)((long)__position._M_current - fb[9].StartingContext.FilePath._M_string_length) >>
           3);
  pcVar6 = (cmFunctionBlocker *)0x0;
  do {
    if (p_Var5 <= p_Var3) goto LAB_0016af0d;
    p_Var5 = p_Var5 + -1;
    ppcVar1 = __position._M_current + -1;
    __position._M_current = __position._M_current + -1;
  } while ((cmListFileFunction *)*ppcVar1 != lff);
  cVar2 = (**(code **)((((cmListFileFunction *)*ppcVar1)->super_cmCommandContext).Name.Lower.
                       _M_dataplus._M_p + 8))();
  if (cVar2 == '\0') {
    cmListFileContext::FromCommandContext
              (&local_1f0,in_RCX,
               (string *)&(lff->super_cmCommandContext).Name.Original._M_string_length);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    poVar4 = std::operator<<(&local_1a8,"A logical block opening on the line\n");
    poVar4 = std::operator<<(poVar4,"  ");
    poVar4 = operator<<(poVar4,(cmListFileContext *)
                               &(lff->super_cmCommandContext).Name.Lower._M_string_length);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"closes on the line\n");
    poVar4 = std::operator<<(poVar4,"  ");
    poVar4 = operator<<(poVar4,&local_1f0);
    poVar4 = std::operator<<(poVar4,"\n");
    std::operator<<(poVar4,"with mis-matching arguments.");
    std::__cxx11::stringbuf::str();
    IssueMessage((cmMakefile *)fb,AUTHOR_WARNING,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    cmListFileContext::~cmListFileContext(&local_1f0);
  }
  pcVar6 = *__position._M_current;
  std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::erase
            ((vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_> *)
             &fb[9].StartingContext.FilePath._M_string_length,__position);
LAB_0016af0d:
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)pcVar6;
  return (__uniq_ptr_data<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>,_true,_true>)
         (__uniq_ptr_data<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmFunctionBlocker> cmMakefile::RemoveFunctionBlocker(
  cmFunctionBlocker* fb, const cmListFileFunction& lff)
{
  // Find the function blocker stack barrier for the current scope.
  // We only remove a blocker whose index is not less than the barrier.
  FunctionBlockersType::size_type barrier = 0;
  if (!this->FunctionBlockerBarriers.empty()) {
    barrier = this->FunctionBlockerBarriers.back();
  }

  // Search for the function blocker whose scope this command ends.
  for (FunctionBlockersType::size_type i = this->FunctionBlockers.size();
       i > barrier; --i) {
    std::vector<cmFunctionBlocker*>::iterator pos =
      this->FunctionBlockers.begin() + (i - 1);
    if (*pos == fb) {
      // Warn if the arguments do not match, but always remove.
      if (!(*pos)->ShouldRemove(lff, *this)) {
        cmListFileContext const& lfc = fb->GetStartingContext();
        cmListFileContext closingContext =
          cmListFileContext::FromCommandContext(lff, lfc.FilePath);
        std::ostringstream e;
        /* clang-format off */
        e << "A logical block opening on the line\n"
          << "  " << lfc << "\n"
          << "closes on the line\n"
          << "  " << closingContext << "\n"
          << "with mis-matching arguments.";
        /* clang-format on */
        this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
      cmFunctionBlocker* b = *pos;
      this->FunctionBlockers.erase(pos);
      return std::unique_ptr<cmFunctionBlocker>(b);
    }
  }

  return std::unique_ptr<cmFunctionBlocker>();
}